

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConcavePolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  uint uVar1;
  uint uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  ImDrawListSharedData *pIVar5;
  uint *puVar6;
  bool bVar7;
  ImVec2 *pIVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  ImVec2 IVar21;
  uint triangle [3];
  ImTriangulator triangulator;
  uint local_98;
  int iStack_94;
  int local_90;
  ImU32 local_8c;
  undefined1 local_88 [24];
  int local_70;
  ImTriangulatorNode **local_68;
  int local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0xffffff < col && 2 < points_count) {
    uVar14 = (ulong)(uint)points_count;
    IVar3 = this->_Data->TexUvWhitePixel;
    local_88._0_4_ = 0;
    local_68 = (ImTriangulatorNode **)0x0;
    local_60 = 0;
    local_88._8_16_ = (undefined1  [16])0x0;
    local_70 = 0;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      if (0 < points_count) {
        uVar9 = 0;
        do {
          this->_VtxWritePtr->pos = points[uVar9];
          this->_VtxWritePtr->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = col;
          this->_VtxWritePtr = pIVar4 + 1;
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      pIVar5 = this->_Data;
      iVar11 = points_count * 0x30 >> 3;
      if ((pIVar5->TempBuffer).Capacity <= iVar11) {
        iVar11 = iVar11 + 1;
        pIVar8 = (pIVar5->TempBuffer).Data;
        if (pIVar8 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar8);
        }
        pIVar8 = (ImVec2 *)ImGui::MemAlloc((long)iVar11 * 8);
        (pIVar5->TempBuffer).Data = pIVar8;
        (pIVar5->TempBuffer).Capacity = iVar11;
      }
      ImTriangulator::Init
                ((ImTriangulator *)local_88,points,points_count,(this->_Data->TempBuffer).Data);
      if (0 < (int)local_88._0_4_) {
        do {
          ImTriangulator::GetNextTriangle((ImTriangulator *)local_88,&local_98);
          puVar6 = this->_IdxWritePtr;
          *puVar6 = local_98 + this->_VtxCurrentIdx;
          puVar6[1] = iStack_94 + this->_VtxCurrentIdx;
          puVar6[2] = local_90 + this->_VtxCurrentIdx;
          this->_IdxWritePtr = puVar6 + 3;
        } while (0 < (int)local_88._0_4_);
      }
    }
    else {
      local_58 = ZEXT416((uint)this->_FringeScale);
      iVar11 = points_count * 2;
      local_8c = col;
      PrimReserve(this,points_count * 9 + -6,iVar11);
      uVar2 = this->_VtxCurrentIdx;
      pIVar5 = this->_Data;
      iVar13 = points_count * 0x30 >> 3;
      if ((pIVar5->TempBuffer).Capacity <= iVar13) {
        iVar13 = iVar13 + 1;
        pIVar8 = (pIVar5->TempBuffer).Data;
        if (pIVar8 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar8);
        }
        pIVar8 = (ImVec2 *)ImGui::MemAlloc((long)iVar13 * 8);
        (pIVar5->TempBuffer).Data = pIVar8;
        (pIVar5->TempBuffer).Capacity = iVar13;
      }
      ImTriangulator::Init
                ((ImTriangulator *)local_88,points,points_count,(this->_Data->TempBuffer).Data);
      if (0 < (int)local_88._0_4_) {
        local_48 = CONCAT44(uVar2,uVar2);
        uStack_40 = 0;
        do {
          ImTriangulator::GetNextTriangle((ImTriangulator *)local_88,&local_98);
          puVar6 = this->_IdxWritePtr;
          *(ulong *)puVar6 = CONCAT44(iStack_94 * 2 + local_48._4_4_,local_98 * 2 + (int)local_48);
          puVar6[2] = uVar2 + local_90 * 2;
          this->_IdxWritePtr = puVar6 + 3;
        } while (0 < (int)local_88._0_4_);
      }
      pIVar5 = this->_Data;
      if ((pIVar5->TempBuffer).Capacity < points_count) {
        pIVar8 = (pIVar5->TempBuffer).Data;
        if (pIVar8 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar8);
        }
        pIVar8 = (ImVec2 *)ImGui::MemAlloc(uVar14 * 8);
        (pIVar5->TempBuffer).Data = pIVar8;
        (pIVar5->TempBuffer).Capacity = points_count;
      }
      pIVar8 = (this->_Data->TempBuffer).Data;
      iVar13 = points_count + -1;
      if (0 < points_count) {
        uVar9 = 0;
        iVar10 = iVar13;
        do {
          fVar15 = points[uVar9].x - points[iVar10].x;
          fVar16 = points[uVar9].y - points[iVar10].y;
          auVar17._0_4_ = fVar15 * fVar15 + fVar16 * fVar16;
          auVar17._4_4_ = fVar16;
          auVar17._8_8_ = 0;
          if (0.0 < auVar17._0_4_) {
            auVar17 = rsqrtss(auVar17,auVar17);
            fVar15 = fVar15 * auVar17._0_4_;
            fVar16 = fVar16 * auVar17._0_4_;
          }
          pIVar8[iVar10].x = fVar16;
          pIVar8[iVar10].y = -fVar15;
          iVar10 = (int)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      bVar7 = 0 < points_count;
      points_count = iVar11;
      if (bVar7) {
        uVar9 = 0;
        uVar12 = uVar2;
        do {
          fVar15 = (pIVar8[uVar9].x + pIVar8[iVar13].x) * 0.5;
          fVar16 = (pIVar8[uVar9].y + pIVar8[iVar13].y) * 0.5;
          fVar18 = fVar15 * fVar15 + fVar16 * fVar16;
          if (1e-06 < fVar18) {
            fVar18 = 1.0 / fVar18;
            fVar19 = 100.0;
            if (fVar18 <= 100.0) {
              fVar19 = fVar18;
            }
            fVar15 = fVar15 * fVar19;
            fVar16 = fVar16 * fVar19;
          }
          fVar15 = fVar15 * (float)local_58._0_4_ * 0.5;
          fVar16 = fVar16 * (float)local_58._0_4_ * 0.5;
          pIVar4 = this->_VtxWritePtr;
          IVar20.x = points[uVar9].x - fVar15;
          IVar20.y = points[uVar9].y - fVar16;
          pIVar4->pos = IVar20;
          pIVar4->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = local_8c;
          IVar21.x = points[uVar9].x + fVar15;
          IVar21.y = points[uVar9].y + fVar16;
          pIVar4[1].pos = IVar21;
          pIVar4[1].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = local_8c & 0xffffff;
          this->_VtxWritePtr = pIVar4 + 2;
          puVar6 = this->_IdxWritePtr;
          *puVar6 = uVar12;
          puVar6[1] = uVar2 + iVar13 * 2;
          uVar1 = uVar2 + 1 + iVar13 * 2;
          puVar6[2] = uVar1;
          puVar6[3] = uVar1;
          puVar6[4] = uVar12 + 1;
          puVar6[5] = uVar12;
          this->_IdxWritePtr = puVar6 + 6;
          iVar13 = (int)uVar9;
          uVar9 = uVar9 + 1;
          uVar12 = uVar12 + 2;
        } while (uVar14 != uVar9);
      }
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + points_count;
  }
  return;
}

Assistant:

void ImDrawList::AddConcavePolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3 || (col & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    ImTriangulator triangulator;
    unsigned int triangle[3];
    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2) * 3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;

        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (triangle[0] << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (triangle[1] << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (triangle[2] << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2) * 3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + triangle[0]); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + triangle[1]); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + triangle[2]);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}